

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

bool __thiscall reflection::EnumVal::Verify(EnumVal *this,Verifier *verifier)

{
  bool bVar1;
  String *str;
  Type *table;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar2;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar3;
  undefined1 local_19;
  Verifier *verifier_local;
  EnumVal *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4);
    local_19 = false;
    if (bVar1) {
      str = name(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,6,8);
        local_19 = false;
        if (bVar1) {
          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10);
          local_19 = false;
          if (bVar1) {
            table = union_type(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTable<reflection::Type>
                              (verifier,table);
            local_19 = false;
            if (bVar1) {
              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xc);
              local_19 = false;
              if (bVar1) {
                pVVar2 = documentation(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::
                        VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                  (verifier,pVVar2);
                local_19 = false;
                if (bVar1) {
                  pVVar2 = documentation(this);
                  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings
                                    (verifier,pVVar2);
                  local_19 = false;
                  if (bVar1) {
                    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0xe);
                    local_19 = false;
                    if (bVar1) {
                      pVVar3 = attributes(this);
                      bVar1 = flatbuffers::VerifierTemplate<false>::
                              VerifyVector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>
                                        (verifier,pVVar3);
                      local_19 = false;
                      if (bVar1) {
                        pVVar3 = attributes(this);
                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                VerifyVectorOfTables<reflection::KeyValue>(verifier,pVVar3);
                        local_19 = false;
                        if (bVar1) {
                          local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyField<int64_t>(verifier, VT_VALUE, 8) &&
           VerifyOffset(verifier, VT_UNION_TYPE) &&
           verifier.VerifyTable(union_type()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           verifier.EndTable();
  }